

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any.h
# Opt level: O3

void __thiscall
density_examples::
any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
::allocate(any<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>,_density::f_equal>
           *this)

{
  tuple_type *ptVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  void *pvVar5;
  void *pvVar6;
  uintptr_t uint_pointer;
  
  ptVar1 = (this->m_type).m_feature_table;
  uVar2 = (ptVar1->
          super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
          ).
          super__Tuple_impl<1UL,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
          .super__Head_base<1UL,_density::f_alignment,_false>._M_head_impl.m_alignment;
  uVar3 = (ptVar1->
          super__Tuple_impl<0UL,_density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy,_density::f_equal>
          ).super__Head_base<0UL,_density::f_size,_false>._M_head_impl.m_size;
  uVar4 = uVar2 - (uVar2 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (1 < uVar4 >> 0x38) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment)",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
               ,0x1ce);
  }
  if (uVar2 < 0x11) {
    pvVar5 = operator_new(uVar3);
  }
  else {
    pvVar6 = operator_new(uVar2 + uVar3);
    if (1 < (byte)(uVar4 >> 0x38)) {
      density_tests::detail::assert_failed<>
                ("is_power_of_2(i_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                 ,200);
    }
    pvVar5 = (void *)(-uVar2 & uVar2 + (long)pvVar6);
    *(void **)((long)pvVar5 + -8) = pvVar6;
    if ((pvVar5 < pvVar6) || (uVar2 + uVar3 + (long)pvVar6 < uVar3 + (long)pvVar5)) {
      density_tests::detail::assert_failed<>
                ("user_block >= complete_block && address_add(user_block, i_size) <= address_add(complete_block, actual_size)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/density_common.h"
                 ,0x1e5);
    }
  }
  this->m_object = pvVar5;
  return;
}

Assistant:

void allocate() { m_object = density::aligned_allocate(m_type.size(), m_type.alignment()); }